

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

void upscale_flow_component(double *flow,int cur_width,int cur_height,int stride,double *tmpbuf)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  void *in_R8;
  int k_3;
  double bottom;
  int k_2;
  double top;
  int j_1;
  int i_3;
  int upscaled_width;
  double *row_1;
  int i_2;
  double *bottom_row;
  double *row;
  int i_1;
  double *top_row;
  int k_1;
  double right;
  int k;
  double left;
  int j;
  int i;
  int half_len;
  int local_ac;
  double local_a8;
  int local_9c;
  double local_98;
  int local_8c;
  int local_88;
  int local_74;
  int local_5c;
  int local_4c;
  double local_48;
  int local_3c;
  double local_38;
  int local_2c;
  int local_28;
  
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      local_38 = 0.0;
      for (local_3c = -2; local_3c < 2; local_3c = local_3c + 1) {
        local_38 = *(double *)(in_RDI + (long)(local_28 * in_ECX + local_2c + local_3c) * 8) *
                   flow_upscale_filter[0][local_3c + 2] + local_38;
      }
      *(double *)((long)in_R8 + (long)(local_28 * in_ECX + local_2c * 2) * 8) = local_38 * 2.0;
      local_48 = 0.0;
      for (local_4c = -1; local_4c < 3; local_4c = local_4c + 1) {
        local_48 = *(double *)(in_RDI + (long)(local_28 * in_ECX + local_2c + local_4c) * 8) *
                   flow_upscale_filter[1][local_4c + 1] + local_48;
      }
      *(double *)((long)in_R8 + (long)(local_28 * in_ECX + local_2c * 2 + 1) * 8) = local_48 * 2.0;
    }
  }
  for (local_5c = -2; local_5c < 0; local_5c = local_5c + 1) {
    memcpy((void *)((long)in_R8 + (long)(local_5c * in_ECX) * 8),in_R8,(long)(in_ESI << 1) << 3);
  }
  for (local_74 = in_EDX; local_74 < in_EDX + 2; local_74 = local_74 + 1) {
    memcpy((void *)((long)in_R8 + (long)(local_74 * in_ECX) * 8),
           (void *)((long)in_R8 + (long)((in_EDX + -1) * in_ECX) * 8),(long)(in_ESI << 1) << 3);
  }
  for (local_88 = 0; local_88 < in_EDX; local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < in_ESI << 1; local_8c = local_8c + 1) {
      local_98 = 0.0;
      for (local_9c = -2; local_9c < 2; local_9c = local_9c + 1) {
        local_98 = *(double *)((long)in_R8 + (long)((local_88 + local_9c) * in_ECX + local_8c) * 8)
                   * flow_upscale_filter[0][local_9c + 2] + local_98;
      }
      *(double *)(in_RDI + (long)(local_88 * 2 * in_ECX + local_8c) * 8) = local_98;
      local_a8 = 0.0;
      for (local_ac = -1; local_ac < 3; local_ac = local_ac + 1) {
        local_a8 = *(double *)((long)in_R8 + (long)((local_88 + local_ac) * in_ECX + local_8c) * 8)
                   * flow_upscale_filter[1][local_ac + 1] + local_a8;
      }
      *(double *)(in_RDI + (long)((local_88 * 2 + 1) * in_ECX + local_8c) * 8) = local_a8;
    }
  }
  return;
}

Assistant:

static void upscale_flow_component(double *flow, int cur_width, int cur_height,
                                   int stride, double *tmpbuf) {
  const int half_len = FLOW_UPSCALE_TAPS / 2;

  // Check that the outer border is large enough to avoid needing to clamp
  // the source locations
  assert(half_len <= FLOW_BORDER_OUTER);

  // Horizontal upscale and multiply by 2
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < cur_width; j++) {
      double left = 0;
      for (int k = -half_len; k < half_len; k++) {
        left +=
            flow[i * stride + (j + k)] * flow_upscale_filter[0][k + half_len];
      }
      tmpbuf[i * stride + (2 * j + 0)] = 2.0 * left;

      // Right output pixel is 0.25 units to the right of the input pixel
      double right = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        right += flow[i * stride + (j + k)] *
                 flow_upscale_filter[1][k + (half_len - 1)];
      }
      tmpbuf[i * stride + (2 * j + 1)] = 2.0 * right;
    }
  }

  // Fill in top and bottom borders of tmpbuf
  const double *top_row = &tmpbuf[0];
  for (int i = -FLOW_BORDER_OUTER; i < 0; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, top_row, 2 * cur_width * sizeof(*row));
  }

  const double *bottom_row = &tmpbuf[(cur_height - 1) * stride];
  for (int i = cur_height; i < cur_height + FLOW_BORDER_OUTER; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, bottom_row, 2 * cur_width * sizeof(*row));
  }

  // Vertical upscale
  int upscaled_width = cur_width * 2;
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < upscaled_width; j++) {
      double top = 0;
      for (int k = -half_len; k < half_len; k++) {
        top +=
            tmpbuf[(i + k) * stride + j] * flow_upscale_filter[0][k + half_len];
      }
      flow[(2 * i) * stride + j] = top;

      double bottom = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        bottom += tmpbuf[(i + k) * stride + j] *
                  flow_upscale_filter[1][k + (half_len - 1)];
      }
      flow[(2 * i + 1) * stride + j] = bottom;
    }
  }
}